

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

ssize_t libssh2_sftp_read(LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t buffer_maxlen)

{
  size_t *psVar1;
  void **ppvVar2;
  libssh2_nonblocking_states lVar3;
  bool bVar4;
  LIBSSH2_CHANNEL *pLVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  list_node *plVar9;
  list_node *plVar10;
  uchar *puVar11;
  char *errmsg;
  list_node *plVar12;
  size_t sVar13;
  list_node *plVar14;
  ssize_t sVar15;
  list_node *unaff_RBP;
  long lVar16;
  LIBSSH2_SESSION *pLVar17;
  LIBSSH2_CHANNEL *channel;
  list_node *plVar18;
  LIBSSH2_SFTP *sftp;
  list_node *plVar19;
  ulong uVar20;
  uchar *s;
  size_t in_stack_ffffffffffffff58;
  ulong *local_98;
  LIBSSH2_SESSION *local_90;
  list_node *local_88;
  list_head *local_80;
  list_node *local_78;
  uchar *local_70;
  uint32_t local_64;
  LIBSSH2_SFTP *local_60;
  list_node *local_58;
  list_node *local_50;
  LIBSSH2_CHANNEL *local_48;
  char *local_40;
  time_t local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    sVar15 = -0x27;
  }
  else {
    local_58 = (list_node *)buffer;
    local_38 = time((time_t *)0x0);
    local_50 = (list_node *)0x800000;
    if ((list_node *)(buffer_maxlen * 4) < (list_node *)0x800000) {
      local_50 = (list_node *)(buffer_maxlen * 4);
    }
    local_64 = (int)local_50 * 8;
    local_40 = hnd->handle;
    local_80 = &hnd->packet_list;
    local_88 = (list_node *)buffer_maxlen;
    do {
      plVar14 = local_50;
      sftp = hnd->sftp;
      channel = sftp->channel;
      pLVar17 = channel->session;
      lVar3 = sftp->read_state;
      local_90 = pLVar17;
      if (lVar3 == libssh2_NB_state_sent2) {
LAB_00123f1c:
        sftp->read_state = libssh2_NB_state_idle;
        plVar19 = (list_node *)_libssh2_list_first(local_80);
        plVar9 = local_58;
        plVar10 = unaff_RBP;
        plVar18 = (list_node *)0x0;
        do {
          plVar14 = plVar18;
          if (plVar19 == (list_node *)0x0) {
            if (plVar14 == (list_node *)0x0) {
              iVar8 = _libssh2_error(local_90,-0x1f,"sftp_read() internal error");
              plVar14 = (list_node *)(long)iVar8;
            }
            break;
          }
          local_70 = (uchar *)0x0;
          plVar18 = plVar14;
          if (plVar19[2].next == (list_node *)0x0) {
            iVar8 = sftp_packet_requirev
                              (sftp,0x133469,(uchar *)(ulong)*(uint *)&plVar19[2].prev,
                               (uint32_t)&local_98,&local_70,(size_t *)0x9,in_stack_ffffffffffffff58
                              );
            pLVar17 = local_90;
            unaff_RBP = plVar9;
            if ((iVar8 == -0x25) && (plVar14 != (list_node *)0x0)) {
              bVar4 = false;
              plVar10 = plVar14;
            }
            else {
              if (iVar8 == -0x26) {
                if (local_70 != (uchar *)0x0) {
                  (*local_90->free)(local_98,&local_90->abstract);
                }
                errmsg = "Response too small";
              }
              else {
                if (iVar8 < 0) {
                  sftp->read_state = libssh2_NB_state_sent2;
                  goto LAB_00123fc2;
                }
                if ((char)*local_98 == 'g') {
                  if (plVar19[1].next == (list_node *)(hnd->u).file.offset) {
                    uVar7 = _libssh2_ntohu32((uchar *)((long)local_98 + 5));
                    plVar12 = (list_node *)(ulong)uVar7;
                    pLVar17 = local_90;
                    if ((list_node *)(local_70 + -9) < plVar12) {
                      errmsg = "SFTP Protocol badness";
                    }
                    else {
                      lVar16 = (long)plVar12 - (long)plVar19[1].prev;
                      if (plVar12 < plVar19[1].prev || lVar16 == 0) {
                        if (lVar16 != 0) {
                          ppvVar2 = &(hnd->u).dir.names_packet;
                          *ppvVar2 = (void *)((long)*ppvVar2 + lVar16);
                        }
                        plVar18 = (list_node *)((long)&plVar14->next + (long)&plVar12->next);
                        sVar13 = (long)plVar18 - (long)local_88;
                        if (plVar18 < local_88 || sVar13 == 0) {
                          puVar11 = (uchar *)0x0;
                        }
                        else {
                          (hnd->u).file.data_left = sVar13;
                          uVar7 = (int)local_88 - (int)plVar14;
                          (hnd->u).file.data = (uchar *)local_98;
                          puVar11 = local_70;
                        }
                        (hnd->u).file.data_len = (size_t)puVar11;
                        uVar20 = (ulong)uVar7;
                        memcpy(plVar9,(char *)((long)local_98 + 9),uVar20);
                        (hnd->u).file.offset = (hnd->u).file.offset + uVar20;
                        if ((hnd->u).file.data_len == 0) {
                          (*local_90->free)(local_98,&local_90->abstract);
                        }
                        plVar18 = (list_node *)((long)&plVar14->next + uVar20);
                        plVar9 = (list_node *)((long)&plVar9->next + uVar20);
                        plVar14 = (list_node *)_libssh2_list_next(plVar19);
                        _libssh2_list_remove(plVar19);
                        (*local_90->free)(plVar19,&local_90->abstract);
                        plVar19 = plVar14;
                        if (local_88 <= plVar18) {
                          plVar19 = (list_node *)0x0;
                        }
                        bVar4 = true;
                        unaff_RBP = plVar9;
                        goto LAB_00123fff;
                      }
                      errmsg = "FXP_READ response too big";
                    }
                  }
                  else {
                    errmsg = "Read Packet At Unexpected Offset";
                  }
                }
                else {
                  if ((char)*local_98 == 'e') {
                    _libssh2_list_remove(plVar19);
                    pLVar17 = local_90;
                    (*local_90->free)(plVar19,&local_90->abstract);
                    sftp_packetlist_flush(hnd);
                    uVar6 = _libssh2_ntohu32((uchar *)((long)local_98 + 5));
                    (*pLVar17->free)(local_98,&pLVar17->abstract);
                    if (uVar6 == 1) {
                      (hnd->u).file.eof = '\x01';
                      bVar4 = false;
                      plVar10 = plVar14;
                    }
                    else {
                      sftp->last_errno = uVar6;
                      iVar8 = _libssh2_error(pLVar17,-0x1f,"SFTP READ error");
                      bVar4 = false;
                      plVar10 = (list_node *)(long)iVar8;
                    }
                    goto LAB_00123fff;
                  }
                  errmsg = "SFTP Protocol badness: unrecognised read request response";
                }
              }
              iVar8 = _libssh2_error(pLVar17,-0x1f,errmsg);
              bVar4 = false;
              plVar10 = (list_node *)(long)iVar8;
            }
          }
          else if (plVar14 == (list_node *)0x0) {
            iVar8 = _libssh2_error(local_90,-0x1f,"sftp_read() internal error");
            plVar14 = (list_node *)0x0;
LAB_00123fc2:
            bVar4 = false;
            plVar10 = (list_node *)(long)iVar8;
            plVar18 = plVar14;
          }
          else {
            bVar4 = false;
            plVar10 = plVar14;
          }
LAB_00123fff:
          plVar14 = plVar10;
          plVar10 = plVar14;
        } while (bVar4);
      }
      else {
        if (lVar3 == libssh2_NB_state_sent) {
LAB_00123ea5:
          sftp->read_state = libssh2_NB_state_idle;
          for (plVar9 = (list_node *)_libssh2_list_first(local_80); plVar9 != (list_node *)0x0;
              plVar9 = (list_node *)_libssh2_list_next(plVar9)) {
            while (plVar9[2].next != (list_node *)0x0) {
              plVar14 = (list_node *)
                        _libssh2_channel_write
                                  (channel,0,
                                   (undefined1 *)((long)&plVar9[2].prev + 4) +
                                   (long)&(plVar9[1].head)->last,(size_t)plVar9[2].next);
              if ((long)plVar14 < 0) {
                sftp->read_state = libssh2_NB_state_sent;
                goto LAB_0012423f;
              }
              plVar9[1].head = (list_head *)((long)&plVar14->next + (long)&(plVar9[1].head)->last);
              plVar10 = plVar9 + 2;
              plVar10->next = (list_node *)((long)plVar10->next - (long)plVar14);
              if (plVar10->next == (list_node *)0x0) break;
              plVar14 = (list_node *)_libssh2_list_first(local_80);
              if (plVar9 != plVar14) goto LAB_00123f1c;
            }
          }
          goto LAB_00123f1c;
        }
        if (lVar3 != libssh2_NB_state_idle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                        ,0x6f4,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
        sftp->last_errno = 0;
        plVar9 = (list_node *)(hnd->u).file.data_left;
        if (plVar9 == (list_node *)0x0) {
          if ((hnd->u).file.eof == '\0') {
            plVar9 = (list_node *)((long)(hnd->u).dir.names_packet - (hnd->u).file.offset);
            local_78 = (list_node *)((long)local_50 - (long)plVar9);
            if (local_50 < plVar9) {
              local_78 = (list_node *)0x0;
            }
            plVar9 = (list_node *)
                     libssh2_channel_window_read_ex
                               (channel,(unsigned_long *)0x0,(unsigned_long *)0x0);
            if (plVar9 < plVar14) {
              bVar4 = false;
              iVar8 = _libssh2_channel_receive_window_adjust
                                (sftp->channel,local_64,'\x01',(uint *)0x0);
              if (iVar8 == 0) goto LAB_00123d29;
              plVar14 = (list_node *)(long)iVar8;
              if (iVar8 == -0x25) {
                if ((hnd->u).file.data_left != 0) {
                  __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                                ,0x5ee,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
                }
                if ((hnd->u).file.eof != '\0') {
                  __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->eof",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                                ,0x5ef,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
                }
                bVar4 = false;
              }
            }
            else {
LAB_00123d29:
              bVar4 = true;
            }
            pLVar5 = channel;
            if (bVar4) {
              do {
                local_48 = pLVar5;
                local_60 = sftp;
                pLVar17 = local_90;
                unaff_RBP = plVar14;
                sftp = local_60;
                if (local_78 == (list_node *)0x0) goto LAB_00123ea5;
                iVar8 = (int)hnd->handle_len;
                plVar18 = (list_node *)(ulong)(iVar8 + 0x19);
                plVar10 = (list_node *)
                          (*local_90->alloc)((size_t)&plVar18[2].head,&local_90->abstract);
                plVar9 = local_78;
                if (plVar10 == (list_node *)0x0) {
                  iVar8 = _libssh2_error(pLVar17,-6,"malloc fail for FXP_WRITE");
                  plVar14 = (list_node *)(long)iVar8;
                }
                else {
                  plVar19 = local_88;
                  if (local_88 <= (list_node *)((ulong)local_78 & 0xffffffff)) {
                    plVar19 = local_78;
                  }
                  uVar7 = (uint)plVar19;
                  if (29999 < (uint)plVar19) {
                    uVar7 = 30000;
                  }
                  plVar19 = (list_node *)(ulong)uVar7;
                  plVar10[1].next = (list_node *)(hnd->u).file.offset_sent;
                  plVar10[1].prev = plVar19;
                  plVar10[2].next = plVar18;
                  plVar10[1].head = (list_head *)0x0;
                  local_98 = (ulong *)((long)&plVar10[2].prev + 4);
                  _libssh2_store_u32((uchar **)&local_98,iVar8 + 0x15);
                  *(undefined1 *)local_98 = 5;
                  uVar6 = local_60->request_id;
                  local_60->request_id = uVar6 + 1;
                  *(uint32_t *)&plVar10[2].prev = uVar6;
                  local_98 = (ulong *)((long)local_98 + 1);
                  _libssh2_store_u32((uchar **)&local_98,uVar6);
                  _libssh2_store_str((uchar **)&local_98,local_40,hnd->handle_len);
                  uVar20 = (hnd->u).file.offset_sent;
                  *local_98 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                              (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                              (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                              (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
                  local_98 = local_98 + 1;
                  ppvVar2 = &(hnd->u).dir.names_packet;
                  *ppvVar2 = (void *)((long)&plVar19->next + (long)*ppvVar2);
                  _libssh2_store_u32((uchar **)&local_98,uVar7);
                  _libssh2_list_add(local_80,plVar10);
                  local_78 = (list_node *)((long)plVar9 - (long)plVar19);
                  channel = local_48;
                  if (plVar9 < plVar19) {
                    local_78 = (list_node *)0x0;
                  }
                }
                sftp = local_60;
                pLVar5 = local_48;
              } while (plVar10 != (list_node *)0x0);
              unaff_RBP = (list_node *)0x0;
            }
          }
          else {
            plVar14 = (list_node *)0x0;
          }
        }
        else {
          plVar14 = local_88;
          if (plVar9 < local_88) {
            plVar14 = plVar9;
          }
          memcpy(local_58,(hnd->u).file.data + ((hnd->u).file.data_len - (long)plVar9),
                 (size_t)plVar14);
          (hnd->u).file.offset = (long)&plVar14->next + (hnd->u).file.offset;
          psVar1 = &(hnd->u).file.data_left;
          *psVar1 = *psVar1 - (long)plVar14;
          if (*psVar1 == 0) {
            (*pLVar17->free)((hnd->u).file.data,&pLVar17->abstract);
            (hnd->u).file.data = (uchar *)0x0;
          }
        }
      }
LAB_0012423f:
      if (plVar14 != (list_node *)0xffffffffffffffdb) {
        return (ssize_t)plVar14;
      }
      pLVar17 = hnd->sftp->channel->session;
      if (pLVar17->api_block_mode == 0) {
        return -0x25;
      }
      iVar8 = _libssh2_wait_socket(pLVar17,local_38);
    } while (iVar8 == 0);
    sVar15 = (ssize_t)iVar8;
  }
  return sVar15;
}

Assistant:

static ssize_t sftp_read(LIBSSH2_SFTP_HANDLE * handle, char *buffer,
                         size_t buffer_size)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t count = 0;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    ssize_t rc;
    struct _libssh2_sftp_handle_file_data *filep =
        &handle->u.file;
    size_t bytes_in_buffer = 0;
    char *sliding_bufferp = buffer;

    /* This function can be interrupted in three different places where it
       might need to wait for data from the network.  It returns EAGAIN to
       allow non-blocking clients to do other work but these client are
       expected to call this function again (possibly many times) to finish
       the operation.

       The tricky part is that if we previously aborted a sftp_read due to
       EAGAIN, we must continue at the same spot to continue the previously
       interrupted operation.  This is done using a state machine to record
       what phase of execution we were at.  The state is stored in
       sftp->read_state.

       libssh2_NB_state_idle: The first phase is where we prepare multiple
       FXP_READ packets to do optimistic read-ahead.  We send off as many as
       possible in the second phase without waiting for a response to each
       one; this is the key to fast reads. But we may have to adjust the
       channel window size to do this which may interrupt this function while
       waiting.  The state machine saves the phase as libssh2_NB_state_idle so
       it returns here on the next call.

       libssh2_NB_state_sent: The second phase is where we send the FXP_READ
       packets.  Writing them to the channel can be interrupted with EAGAIN
       but the state machine ensures we skip the first phase on the next call
       and resume sending.

       libssh2_NB_state_sent2: In the third phase (indicated by ) we read the
       data from the responses that have arrived so far.  Reading can be
       interrupted with EAGAIN but the state machine ensures we skip the first
       and second phases on the next call and resume sending.
    */

    switch(sftp->read_state) {
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Some data may already have been read from the server in the
           previous call but didn't fit in the buffer at the time.  If so, we
           return that now as we can't risk being interrupted later with data
           partially written to the buffer. */
        if(filep->data_left) {
            size_t copy = LIBSSH2_MIN(buffer_size, filep->data_left);

            memcpy(buffer, &filep->data[ filep->data_len - filep->data_left],
                   copy);

            filep->data_left -= copy;
            filep->offset += copy;

            if(!filep->data_left) {
                LIBSSH2_FREE(session, filep->data);
                filep->data = NULL;
            }

            return copy;
        }

        if(filep->eof) {
            return 0;
        }
        else {
            /* We allow a number of bytes being requested at any given time
               without having been acked - until we reach EOF. */

            /* Number of bytes asked for that haven't been acked yet */
            size_t already = (size_t)(filep->offset_sent - filep->offset);

            size_t max_read_ahead = buffer_size*4;
            unsigned long recv_window;

            if(max_read_ahead > LIBSSH2_CHANNEL_WINDOW_DEFAULT*4)
                max_read_ahead = LIBSSH2_CHANNEL_WINDOW_DEFAULT*4;

            /* if the buffer_size passed in now is smaller than what has
               already been sent, we risk getting count become a very large
               number */
            if(max_read_ahead > already)
                count = max_read_ahead - already;

            /* 'count' is how much more data to ask for, and 'already' is how
               much data that already has been asked for but not yet returned.
               Specifically, 'count' means how much data that have or will be
               asked for by the nodes that are already added to the linked
               list. Some of those read requests may not actually have been
               sent off successfully yet.

               If 'already' is very large it should be perfectly fine to have
               count set to 0 as then we don't have to ask for more data
               (right now).

               buffer_size*4 is just picked more or less out of the air. The
               idea is that when reading SFTP from a remote server, we send
               away multiple read requests guessing that the client will read
               more than only this 'buffer_size' amount of memory. So we ask
               for maximum buffer_size*4 amount of data so that we can return
               them very fast in subsequent calls.
            */

            recv_window = libssh2_channel_window_read_ex(sftp->channel,
                                                         NULL, NULL);
            if(max_read_ahead > recv_window) {
                /* more data will be asked for than what the window currently
                   allows, expand it! */

                rc = _libssh2_channel_receive_window_adjust(sftp->channel,
                                               (uint32_t)(max_read_ahead * 8),
                                               1, NULL);
                /* if this returns EAGAIN, we will get back to this function
                   at next call */
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left);
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->eof);
                if(rc)
                    return rc;
            }
        }

        while(count > 0) {
            unsigned char *s;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            uint32_t packet_len = (uint32_t)(handle->handle_len + 25);
            uint32_t request_id;

            uint32_t size = (uint32_t)count;
            if(size < buffer_size)
                size = (uint32_t)buffer_size;
            if(size > MAX_SFTP_READ_SIZE)
                size = MAX_SFTP_READ_SIZE;

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->offset = filep->offset_sent;
            chunk->len = size;
            chunk->lefttosend = packet_len;
            chunk->sent = 0;

            s = chunk->packet;

            _libssh2_store_u32(&s, packet_len - 4);
            *s++ = SSH_FXP_READ;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, filep->offset_sent);
            filep->offset_sent += size; /* advance offset at once */
            _libssh2_store_u32(&s, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);
            /* deduct the size we used, as we might have to create
               more packets */
            count -= LIBSSH2_MIN(size, count);
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "read request id %d sent (offset: %d, size: %d)",
                           request_id, (int)chunk->offset, (int)chunk->len));
        }
        /* FALL-THROUGH */
    case libssh2_NB_state_sent:

        sftp->read_state = libssh2_NB_state_idle;

        /* move through the READ packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {

                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0) {
                    sftp->read_state = libssh2_NB_state_sent;
                    return rc;
                }

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend) {
                    /* We still have data left to send for this chunk.
                     * If there is at least one completely sent chunk,
                     * we can get out of this loop and start reading.  */
                    if(chunk != _libssh2_list_first(&handle->packet_list)) {
                        break;
                    }
                    else {
                        continue;
                    }
                }
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }
        /* FALL-THROUGH */

    case libssh2_NB_state_sent2:

        sftp->read_state = libssh2_NB_state_idle;

        /*
         * Count all ACKed packets and act on the contents of them.
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            unsigned char *data;
            size_t data_len = 0;
            uint32_t rc32;
            static const unsigned char read_responses[2] = {
                SSH_FXP_DATA, SSH_FXP_STATUS
            };

            if(chunk->lefttosend) {
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                if(bytes_in_buffer > 0) {
                    return bytes_in_buffer;
                }
                else {
                    /* we should never reach this point */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "sftp_read() internal error");
                }
            }

            rc = sftp_packet_requirev(sftp, 2, read_responses,
                                      chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_EAGAIN && bytes_in_buffer) {
                /* do not return EAGAIN if we have already
                 * written data into the buffer */
                return bytes_in_buffer;
            }

            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "Response too small");
            }
            else if(rc < 0) {
                sftp->read_state = libssh2_NB_state_sent2;
                return rc;
            }

            /*
             * We get DATA or STATUS back. STATUS can be error, or it is
             * FX_EOF when we reach the end of the file.
             */

            switch(data[0]) {
            case SSH_FXP_STATUS:
                /* remove the chunk we just processed */

                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* we must remove all outstanding READ requests, as either we
                   got an error or we're at end of file */
                sftp_packetlist_flush(handle);

                rc32 = _libssh2_ntohu32(data + 5);
                LIBSSH2_FREE(session, data);

                if(rc32 == LIBSSH2_FX_EOF) {
                    filep->eof = TRUE;
                    return bytes_in_buffer;
                }
                else {
                    sftp->last_errno = rc32;
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP READ error");
                }
                break;

            case SSH_FXP_DATA:
                if(chunk->offset != filep->offset) {
                    /* This could happen if the server returns less bytes than
                       requested, which shouldn't happen for normal files. See:
                       https://tools.ietf.org/html/draft-ietf-secsh-filexfer-02
                       #section-6.4
                     */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "Read Packet At Unexpected Offset");
                }

                rc32 = _libssh2_ntohu32(data + 5);
                if(rc32 > (data_len - 9))
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP Protocol badness");

                if(rc32 > chunk->len) {
                    /* A chunk larger than we requested was returned to us.
                       This is a protocol violation and we don't know how to
                       deal with it. Bail out! */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "FXP_READ response too big");
                }

                if(rc32 != chunk->len) {
                    /* a short read does not imply end of file, but we must
                       adjust the offset_sent since it was advanced with a
                       full chunk->len before */
                    filep->offset_sent -= (chunk->len - rc32);
                }

                if((bytes_in_buffer + rc32) > buffer_size) {
                    /* figure out the overlap amount */
                    filep->data_left = (bytes_in_buffer + rc32) - buffer_size;

                    /* getting the full packet would overflow the buffer, so
                       only get the correct amount and keep the remainder */
                    rc32 = (uint32_t)(buffer_size - bytes_in_buffer);

                    /* store data to keep for next call */
                    filep->data = data;
                    filep->data_len = data_len;
                }
                else
                    filep->data_len = 0;

                /* copy the received data from the received FXP_DATA packet to
                   the buffer at the correct index */
                memcpy(sliding_bufferp, data + 9, rc32);
                filep->offset += rc32;
                bytes_in_buffer += rc32;
                sliding_bufferp += rc32;

                if(filep->data_len == 0)
                    /* free the allocated data if not stored to keep */
                    LIBSSH2_FREE(session, data);

                /* remove the chunk we just processed keeping track of the
                 * next one in case we need it */
                next = _libssh2_list_next(&chunk->node);
                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* check if we have space left in the buffer
                 * and either continue to the next chunk or stop
                 */
                if(bytes_in_buffer < buffer_size) {
                    chunk = next;
                }
                else {
                    chunk = NULL;
                }

                break;
            default:
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "SFTP Protocol badness: unrecognised "
                                      "read request response");
            }
        }

        if(bytes_in_buffer > 0)
            return bytes_in_buffer;

        break;

    default:
        assert(0);  /* State machine error; unrecognised read state */
    }

    /* we should never reach this point */
    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                          "sftp_read() internal error");
}